

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall
jaegertracing::agent::thrift::AgentProcessor::process_emitZipkinBatch
          (AgentProcessor *this,int32_t param_1,TProtocol *iprot,TProtocol *param_3,
          void *callContext)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  int iVar4;
  TProtocol *extraout_RDX;
  TProtocol *__buf;
  undefined1 auVar5 [16];
  Agent_emitZipkinBatch_args args;
  element_type *local_68;
  undefined8 uStack_60;
  Agent_emitZipkinBatch_args local_50;
  
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_68 = (element_type *)0x0;
    uStack_60 = 0;
    local_50.__isset = (_Agent_emitZipkinBatch_args__isset)0x0;
    __buf = iprot;
  }
  else {
    auVar5 = (**(code **)(*(long *)peVar1 + 0x10))(peVar1,"Agent.emitZipkinBatch",callContext);
    uStack_60 = auVar5._0_8_;
    local_68 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
               super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    if (local_68 == (element_type *)0x0) {
      local_50.__isset = (_Agent_emitZipkinBatch_args__isset)0x0;
      __buf = auVar5._8_8_;
    }
    else {
      (**(code **)(*(long *)local_68 + 0x20))(local_68,uStack_60,"Agent.emitZipkinBatch");
      local_50.__isset = (_Agent_emitZipkinBatch_args__isset)((byte)local_50.__isset & 0xfe);
      __buf = extraout_RDX;
    }
  }
  local_50._vptr_Agent_emitZipkinBatch_args =
       (_func_int **)&PTR__Agent_emitZipkinBatch_args_002723e8;
  local_50.spans.
  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.spans.
  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.spans.
  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Agent_emitZipkinBatch_args::read(&local_50,(int)iprot,__buf,0x2723e8);
  (*iprot->_vptr_TProtocol[0x18])(iprot);
  peVar2 = (iprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (iprot->ptrans_).
            super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar4 = (*peVar2->_vptr_TTransport[8])();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x28))(peVar1,uStack_60,"Agent.emitZipkinBatch",iVar4);
  }
  peVar3 = (this->iface_).
           super___shared_ptr<jaegertracing::agent::thrift::AgentIf,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**(code **)(*(long *)peVar3 + 0x10))(peVar3,&local_50.spans);
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x40))(peVar1,uStack_60,"Agent.emitZipkinBatch");
  }
  Agent_emitZipkinBatch_args::~Agent_emitZipkinBatch_args(&local_50);
  if (local_68 != (element_type *)0x0) {
    (**(code **)(*(long *)local_68 + 0x18))(local_68,uStack_60,"Agent.emitZipkinBatch");
  }
  return;
}

Assistant:

void AgentProcessor::process_emitZipkinBatch(int32_t, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol*, void* callContext)
{
  void* ctx = NULL;
  if (this->eventHandler_.get() != NULL) {
    ctx = this->eventHandler_->getContext("Agent.emitZipkinBatch", callContext);
  }
  ::apache::thrift::TProcessorContextFreer freer(this->eventHandler_.get(), ctx, "Agent.emitZipkinBatch");

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preRead(ctx, "Agent.emitZipkinBatch");
  }

  Agent_emitZipkinBatch_args args;
  args.read(iprot);
  iprot->readMessageEnd();
  uint32_t bytes = iprot->getTransport()->readEnd();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postRead(ctx, "Agent.emitZipkinBatch", bytes);
  }

  try {
    iface_->emitZipkinBatch(args.spans);
  } catch (const std::exception&) {
    if (this->eventHandler_.get() != NULL) {
      this->eventHandler_->handlerError(ctx, "Agent.emitZipkinBatch");
    }
    return;
  }

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->asyncComplete(ctx, "Agent.emitZipkinBatch");
  }

  return;
}